

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O0

void __thiscall
jsonChildren::insert(jsonChildren *this,JSONNode ***position,JSONNode **items,json_index_t num)

{
  size_t ptrs;
  iteratorKeeper<false> ik;
  json_index_t num_local;
  JSONNode **items_local;
  JSONNode ***position_local;
  jsonChildren *this_local;
  
  ik.myPos._4_4_ = num;
  iteratorKeeper<false>::iteratorKeeper((iteratorKeeper<false> *)&ptrs,this,position);
  inc(this,ik.myPos._4_4_);
  iteratorKeeper<false>::~iteratorKeeper((iteratorKeeper<false> *)&ptrs);
  memmove(*position + ik.myPos._4_4_,*position,
          ((long)((long)this->array + ((ulong)this->mysize * 8 - (long)*position)) >> 3) << 3);
  memcpy(*position,items,(ulong)ik.myPos._4_4_ << 3);
  this->mysize = ik.myPos._4_4_ + this->mysize;
  return;
}

Assistant:

void insert(JSONNode ** & position, JSONNode ** items, json_index_t num) json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null insert 2"));
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array insert 2"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("position is above the end of the array insert 2"));
	   {
		  iteratorKeeper<false> ik(this, position);
		  inc(num);
	   }
	   const size_t ptrs = ((JSONNode **)(array + mysize)) - position;
	   std::memmove(position + num, position, ptrs * sizeof(JSONNode *));
	   std::memcpy(position, items, num * sizeof(JSONNode *));
	   mysize += num;
    }